

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::
Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
::Maybe(Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
        *this,Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
              *other)

{
  bool bVar1;
  Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *pMVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = bVar1;
  if (bVar1 == true) {
    (this->ptr).field_1.value.value.ptr = (other->ptr).field_1.value.value.ptr;
    (this->ptr).field_1.value.value.size_ = (other->ptr).field_1.value.value.size_;
    (this->ptr).field_1.value.value.disposer = (other->ptr).field_1.value.value.disposer;
    (other->ptr).field_1.value.value.ptr =
         (Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *)0x0;
    (other->ptr).field_1.value.value.size_ = 0;
    *(undefined8 *)((long)&(this->ptr).field_1 + 0x18) =
         *(undefined8 *)((long)&(other->ptr).field_1 + 0x18);
  }
  if ((other->ptr).isSet == true) {
    (other->ptr).isSet = false;
    pMVar2 = (other->ptr).field_1.value.value.ptr;
    if (pMVar2 != (Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *)
                  0x0) {
      sVar3 = (other->ptr).field_1.value.value.size_;
      (other->ptr).field_1.value.value.ptr =
           (Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *)0x0;
      (other->ptr).field_1.value.value.size_ = 0;
      pAVar4 = (other->ptr).field_1.value.value.disposer;
      (**pAVar4->_vptr_ArrayDisposer)
                (pAVar4,pMVar2,0x20,sVar3,sVar3,
                 ArrayDisposer::
                 Dispose_<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>
                 ::destruct);
    }
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }